

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O3

void __thiscall
AccountingTestMemoryAllocator::free_memory
          (AccountingTestMemoryAllocator *this,char *memory,size_t param_2,char *file,size_t line)

{
  size_t size;
  MemoryAccountantAllocationNode *pMVar1;
  
  size = removeMemoryFromTrackingAndReturnAllocatedSize(this,memory);
  pMVar1 = MemoryAccountant::findOrCreateNodeOfSize(this->accountant_,size);
  pMVar1->deallocations_ = pMVar1->deallocations_ + 1;
  if (pMVar1->currentAllocations_ != 0) {
    pMVar1->currentAllocations_ = pMVar1->currentAllocations_ - 1;
  }
  (*this->originalAllocator_->_vptr_TestMemoryAllocator[3])
            (this->originalAllocator_,memory,size,file,line);
  return;
}

Assistant:

void AccountingTestMemoryAllocator::free_memory(char* memory, size_t, const char* file, size_t line)
{
    size_t size = removeMemoryFromTrackingAndReturnAllocatedSize(memory);
    accountant_.dealloc(size);
    originalAllocator_->free_memory(memory, size, file, line);
}